

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int CVmObjBigNum::compute_eq_round(char *ext1,char *ext2)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *in_RSI;
  char *in_RDI;
  int ret;
  uint tmp_hdl;
  char *tmp_ext;
  char *longer;
  char *shorter;
  size_t prec2;
  size_t prec1;
  uint local_44;
  undefined1 local_40 [4];
  int in_stack_ffffffffffffffc4;
  char *src;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  sVar2 = get_prec((char *)0x2b86e8);
  sVar3 = get_prec((char *)0x2b86f7);
  src = in_RDI;
  if ((sVar3 < sVar2) || (src = in_RSI, in_RSI = in_RDI, sVar2 < sVar3)) {
    sVar2 = get_prec((char *)0x2b8761);
    alloc_temp_regs(sVar2,1,local_40,&local_44);
    copy_val(in_RSI,src,in_stack_ffffffffffffffc4);
    iVar1 = compute_eq_exact((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             in_RDI);
    release_temp_regs(1,(ulong)local_44);
  }
  else {
    iVar1 = compute_eq_exact((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             in_RDI);
  }
  return iVar1;
}

Assistant:

int CVmObjBigNum::compute_eq_round(VMG_ const char *ext1, const char *ext2)
{
    size_t prec1 = get_prec(ext1);
    size_t prec2 = get_prec(ext2);
    const char *shorter;
    const char *longer;
    char *tmp_ext;
    uint tmp_hdl;
    int ret;
    
    /* 
     *   allocate a temporary register with a rounded copy of the more
     *   precise of the values 
     */
    if (prec1 > prec2)
    {
        /* the first one is longer */
        longer = ext1;
        shorter = ext2;
    }
    else if (prec1 < prec2)
    {
        /* the second one is longer */
        longer = ext2;
        shorter = ext1;
    }
    else
    {
        /* they're the same - do an exact comparison */
        return compute_eq_exact(ext1, ext2);
    }

    /* get a temp register for rounding the longer value */
    alloc_temp_regs(get_prec(shorter), 1, &tmp_ext, &tmp_hdl);

    /* make a rounded copy */
    copy_val(tmp_ext, longer, TRUE);

    /* compare the rounded copy of the longer value to the shorter value */
    ret = compute_eq_exact(shorter, tmp_ext);

    /* release the temporary register */
    release_temp_regs(1, tmp_hdl);

    /* return the result */
    return ret;
}